

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O3

uint logdir_open(logdir *ld,char *fn)

{
  stralloc *sa;
  unsigned_long *u;
  unsigned_long *u_00;
  stralloc *sa_00;
  stralloc *sa_01;
  byte bVar1;
  char cVar2;
  taia *t;
  int iVar3;
  uint uVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  char *pcVar10;
  unsigned_long *u_01;
  unsigned_long uVar11;
  char *pcVar12;
  unsigned_long port;
  unsigned_long local_58;
  taia *local_50;
  unsigned_long *local_48;
  unsigned_long *local_40;
  in_addr *local_38;
  
  iVar3 = open_read(fn);
  ld->fddir = iVar3;
  if (iVar3 == -1) {
    pcVar12 = "unable to open log directory";
LAB_001055ba:
    strerr_warn("svlogd: warning: ",pcVar12,": ",fn,": ",(char *)0x0,&strerr_sys);
    return 0;
  }
  coe(iVar3);
  iVar3 = fchdir(ld->fddir);
  if (iVar3 == -1) {
    logdir_close(ld);
    pcVar12 = "unable to change directory";
    goto LAB_001055ba;
  }
  iVar3 = open_append("lock");
  ld->fdlock = iVar3;
  if ((iVar3 == -1) || (iVar3 = lock_exnb(iVar3), iVar3 == -1)) {
    logdir_close(ld);
    strerr_warn("svlogd: warning: ","unable to lock directory",": ",fn,": ",(char *)0x0,&strerr_sys)
    ;
    iVar3 = fchdir(fdwdir);
    while (iVar3 == -1) {
      strerr_warn("svlogd: pausing: ","unable to change to initial working directory",": ",
                  (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
      sleep(3);
      iVar3 = fchdir(fdwdir);
    }
    return 0;
  }
  coe(ld->fdlock);
  ld->size = 0;
  ld->sizemax = 1000000;
  ld->nmin = 10;
  ld->nmax = 10;
  ld->tmax = 0;
  ld->name = fn;
  ld->ppid = 0;
  ld->match = '+';
  (ld->udpaddr).sin_port = 0;
  ld->udponly = 0;
  sa_00 = &ld->prefix;
  iVar3 = stralloc_copys(sa_00,"");
  while (iVar3 == 0) {
    strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
                ,(strerr *)0x0);
    sleep(3);
    iVar3 = stralloc_copys(sa_00,"");
  }
  sa = &ld->inst;
  iVar3 = stralloc_copys(sa,"");
  while (iVar3 == 0) {
    strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
                ,(strerr *)0x0);
    sleep(3);
    iVar3 = stralloc_copys(sa,"");
  }
  sa_01 = &ld->processor;
  iVar3 = stralloc_copys(sa_01,"");
  while (iVar3 == 0) {
    strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
                ,(strerr *)0x0);
    sleep(3);
    iVar3 = stralloc_copys(sa_01,"");
  }
  iVar3 = openreadclose("config",&::sa,0x80);
  if (iVar3 != 0) {
    if (iVar3 == -1) {
      strerr_warn("svlogd: warning: ","unable to read config",": ",ld->name,": ",(char *)0x0,
                  &strerr_sys);
    }
    if (verbose != 0) {
      strerr_warn("svlogd: info: ","read: ",ld->name,"/config",(char *)0x0,(char *)0x0,(strerr *)0x0
                 );
    }
    if (1 < ::sa.len) {
      u = &ld->sizemax;
      local_48 = &ld->nmin;
      local_40 = &ld->nmax;
      u_00 = &ld->tmax;
      local_50 = &ld->trotate;
      local_38 = &(ld->udpaddr).sin_addr;
      uVar8 = 1;
      iVar3 = 0;
      do {
        lVar9 = (long)iVar3;
        uVar4 = byte_chr(::sa.s + lVar9,::sa.len - iVar3,10);
        iVar7 = uVar4 + iVar3;
        ::sa.s[iVar7] = '\0';
        pcVar10 = ::sa.s;
        pcVar12 = ::sa.s + lVar9;
        bVar1 = ::sa.s[lVar9];
        uVar6 = (ulong)(bVar1 - 0x2b);
        if (bVar1 - 0x2b < 0x3b) {
          if ((0x400000004000005U >> (uVar6 & 0x3f) & 1) == 0) {
            u_01 = local_48;
            if (uVar6 == 0x23) goto LAB_00105299;
            if (uVar6 != 0x2a) goto code_r0x00105031;
            ld->udponly = 1;
            goto switchD_0010504d_caseD_75;
          }
          iVar3 = stralloc_catb(sa,pcVar12,uVar4);
          while (iVar3 == 0) {
            strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,
                        (char *)0x0,(strerr *)0x0);
            sleep(3);
            iVar3 = stralloc_catb(sa,::sa.s + lVar9,uVar4);
          }
          while (iVar3 = stralloc_append(sa,""), iVar3 == 0) {
            strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,
                        (char *)0x0,(strerr *)0x0);
            sleep(3);
          }
        }
        else {
code_r0x00105031:
          switch(bVar1) {
          case 0x6e:
            u_01 = local_40;
LAB_00105299:
            scan_ulong(::sa.s + (int)uVar8,u_01);
            break;
          case 0x6f:
          case 0x71:
          case 0x72:
            break;
          case 0x70:
            if (1 < (int)uVar4) {
              while (iVar3 = stralloc_copys(sa_00,::sa.s + (int)uVar8), iVar3 == 0) {
                strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0
                            ,(char *)0x0,(strerr *)0x0);
                sleep(3);
              }
              while (iVar3 = stralloc_append(sa_00,""), iVar3 == 0) {
                strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0
                            ,(char *)0x0,(strerr *)0x0);
                sleep(3);
              }
            }
            break;
          case 0x73:
            uVar8 = scan_ulong(::sa.s + (int)uVar8,u);
            cVar2 = pcVar10[uVar8 + iVar3 + 1];
            if (cVar2 == 'k') {
              *u = *u << 10;
            }
            else if (cVar2 == 'm') {
              *u = *u << 0x14;
            }
            break;
          case 0x74:
            uVar8 = scan_ulong(::sa.s + (int)uVar8,u_00);
            t = local_50;
            cVar2 = pcVar10[uVar8 + iVar3 + 1];
            uVar11 = *u_00;
            if (cVar2 == 'd') {
              lVar9 = 0x15180;
LAB_00105358:
              uVar11 = uVar11 * lVar9;
              *u_00 = uVar11;
            }
            else {
              if (cVar2 == 'm') {
                lVar9 = 0x3c;
                goto LAB_00105358;
              }
              if (cVar2 == 'h') {
                lVar9 = 0xe10;
                goto LAB_00105358;
              }
            }
            if (uVar11 != 0) {
              taia_uint(local_50,(uint)uVar11);
              taia_add(t,&now,t);
              if ((tmaxflag == 0) || (iVar3 = taia_less(t,&trotate), iVar3 != 0)) {
                trotate.atto = t->atto;
                trotate.sec.x = (t->sec).x;
                trotate.nano = t->nano;
              }
              tmaxflag = 1;
            }
            break;
          case 0x75:
switchD_0010504d_caseD_75:
            uVar4 = ip4_scan(pcVar12 + 1,(char *)local_38);
            if (uVar4 == 0) {
              pcVar12 = ::sa.s + lVar9 + 1;
              pcVar10 = "unable to scan ip address";
LAB_001052bf:
              strerr_warn("svlogd: warning: ",pcVar10,": ",pcVar12,(char *)0x0,(char *)0x0,
                          (strerr *)0x0);
            }
            else {
              if (::sa.s[(int)(uVar8 + uVar4)] == ':') {
                scan_ulong(::sa.s + (int)uVar4 + lVar9 + 2,&local_58);
                if (local_58 == 0) {
                  pcVar12 = ::sa.s + (int)uVar4 + lVar9 + 2;
                  pcVar10 = "unable to scan port number";
                  goto LAB_001052bf;
                }
              }
              else {
                local_58 = 0x202;
              }
              (ld->udpaddr).sin_port = (ushort)local_58 << 8 | (ushort)local_58 >> 8;
            }
            break;
          default:
            if ((bVar1 == 0x21) && (1 < (int)uVar4)) {
              iVar3 = stralloc_copys(sa_01,::sa.s + (int)uVar8);
              while (iVar3 == 0) {
                strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0
                            ,(char *)0x0,(strerr *)0x0);
                sleep(3);
                iVar3 = stralloc_copys(sa_01,::sa.s + (int)uVar8);
              }
              while (iVar3 = stralloc_append(sa_01,""), iVar3 == 0) {
                strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0
                            ,(char *)0x0,(strerr *)0x0);
                sleep(3);
              }
            }
          }
        }
        iVar3 = iVar7 + 1;
        uVar8 = iVar7 + 2;
      } while (uVar8 < ::sa.len);
    }
  }
  iVar3 = stat("current",(stat *)&st);
  if (iVar3 == -1) {
    piVar5 = __errno_location();
    if (*piVar5 != error_noent) {
      logdir_close(ld);
      strerr_warn("svlogd: warning: ","unable to stat current",": ",ld->name,": ",(char *)0x0,
                  &strerr_sys);
      iVar3 = fchdir(fdwdir);
      while (iVar3 == -1) {
        strerr_warn("svlogd: pausing: ","unable to change to initial working directory",": ",
                    (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
        sleep(3);
        iVar3 = fchdir(fdwdir);
      }
      return 0;
    }
  }
  else {
    if ((st.st_size == 0) || (((byte)st.st_mode & 0x40) != 0)) {
      ld->size = st.st_size;
      pcVar12 = "new: ";
      if (iVar3 == 0) {
        pcVar12 = "append: ";
      }
      goto LAB_0010562b;
    }
    pcVar12 = ld->fnsave;
    ld->fnsave[0x19] = '.';
    ld->fnsave[0x1a] = 'u';
    ld->fnsave[0x1b] = '\0';
    do {
      do {
        taia_now(&now);
        fmt_taia(pcVar12,&now);
        piVar5 = __errno_location();
        *piVar5 = 0;
        iVar3 = stat(pcVar12,(stat *)&st);
      } while (iVar3 != -1);
    } while (*piVar5 != error_noent);
    iVar3 = rename("current",pcVar12);
    while (iVar3 == -1) {
      strerr_warn("svlogd: pausing: ","unable to rename current",": ",ld->name,": ",(char *)0x0,
                  &strerr_sys);
      sleep(3);
      iVar3 = rename("current",pcVar12);
    }
    rmoldest(ld);
  }
  pcVar12 = "new: ";
LAB_0010562b:
  iVar3 = open_append("current");
  ld->fdcur = iVar3;
  while (iVar3 == -1) {
    strerr_warn("svlogd: pausing: ","unable to open current",": ",ld->name,": ",(char *)0x0,
                &strerr_sys);
    sleep(3);
    iVar3 = open_append("current");
    ld->fdcur = iVar3;
  }
  coe(iVar3);
  iVar3 = fchmod(ld->fdcur,0x1a4);
  while (iVar3 == -1) {
    strerr_warn("svlogd: pausing: ","unable to set mode of current",": ",ld->name,": ",(char *)0x0,
                &strerr_sys);
    sleep(3);
    iVar3 = fchmod(ld->fdcur,0x1a4);
  }
  buffer_init(&ld->b,buffer_pwrite,(int)((ulong)((long)ld - (long)dir) >> 4) * -0x11111111,ld->btmp,
              (uint)buflen);
  if (verbose != 0) {
    strerr_warn("svlogd: info: ",pcVar12,ld->name,"/current",(char *)0x0,(char *)0x0,(strerr *)0x0);
  }
  iVar3 = fchdir(fdwdir);
  while (iVar3 == -1) {
    strerr_warn("svlogd: pausing: ","unable to change to initial working directory",": ",(char *)0x0
                ,(char *)0x0,(char *)0x0,&strerr_sys);
    sleep(3);
    iVar3 = fchdir(fdwdir);
  }
  return 1;
}

Assistant:

unsigned int logdir_open(struct logdir *ld, const char *fn) {
  int i;

  if ((ld->fddir =open_read(fn)) == -1) {
    warn2("unable to open log directory", (char*)fn);
    return(0);
  }
  coe(ld->fddir);
  if (fchdir(ld->fddir) == -1) {
    logdir_close(ld);
    warn2("unable to change directory", (char*)fn);
    return(0);
  }
  ld->fdlock =open_append("lock");
  if ((ld->fdlock == -1) || (lock_exnb(ld->fdlock) == -1)) {
    logdir_close(ld);
    warn2("unable to lock directory", (char*)fn);
    while (fchdir(fdwdir) == -1)
      pause1("unable to change to initial working directory");
    return(0);
  }
  coe(ld->fdlock);

  ld->size =0;
  ld->sizemax =1000000;
  ld->nmax =ld->nmin =10;
  ld->tmax =0;
  ld->name =(char*)fn;
  ld->ppid =0;
  ld->match ='+';
  ld->udpaddr.sin_port =0;
  ld->udponly =0;
  while (! stralloc_copys(&ld->prefix, "")) pause_nomem();
  while (! stralloc_copys(&ld->inst, "")) pause_nomem();
  while (! stralloc_copys(&ld->processor, "")) pause_nomem();

  /* read config */
  if ((i =openreadclose("config", &sa, 128)) == -1)
    warn2("unable to read config", ld->name);
  if (i != 0) {
    int len, c;
    unsigned long port;

    if (verbose) strerr_warn4(INFO, "read: ", ld->name, "/config", 0);
    for (i =0; i +1 < sa.len; ++i) {
      len =byte_chr(&sa.s[i], sa.len -i, '\n');
      sa.s[len +i] =0;
      switch(sa.s[i]) {
      case '\n':
      case '#':
         break;
      case '+':
      case '-':
      case 'e':
      case 'E':
        while (! stralloc_catb(&ld->inst, &sa.s[i], len)) pause_nomem();
        while (! stralloc_0(&ld->inst)) pause_nomem();
        break;
      case 's':
        /* Handle modifiers.  Do this the right way with breaks and all */
        switch (sa.s[scan_ulong(&sa.s[i +1], &ld->sizemax) +i +1]) {
          case 'm': ld->sizemax *= 1024 * 1024; break;
          case 'k': ld->sizemax *= 1024; break;
        }
        break;
      case 'n':
        scan_ulong(&sa.s[i +1], &ld->nmax);
        break;
      case 'N':
        scan_ulong(&sa.s[i +1], &ld->nmin);
        break;
      case 't':
        /* Handle modifiers.  Do this the right way with breaks and all */
        switch (sa.s[scan_ulong(&sa.s[i +1], &ld->tmax) +i +1]) {        
            case 'd': ld->tmax *= (24 * 60 * 60); break;
            case 'h': ld->tmax *= (60 * 60); break;
            case 'm': ld->tmax *= 60; break;
        }
        if (ld->tmax) {
          taia_uint(&ld->trotate, ld->tmax);
          taia_add(&ld->trotate, &now, &ld->trotate);
          if (! tmaxflag || taia_less(&ld->trotate, &trotate))
            trotate =ld->trotate;
          tmaxflag =1;
        }
        break;
      case '!':
        if (len > 1) {
          while (! stralloc_copys(&ld->processor, &sa.s[i +1])) pause_nomem();
          while (! stralloc_0(&ld->processor)) pause_nomem();
        }
        break;
      case 'U':
        ld->udponly =1;
      case 'u':
        if (! (c =ip4_scan(sa.s +i +1, (char *)&ld->udpaddr.sin_addr))) {
          warnx("unable to scan ip address", sa.s +i +1);
          break;
        }
        if (sa.s[i +1 +c] == ':') {
          scan_ulong(sa.s +i +c +2, &port);
          if (port == 0) {
            warnx("unable to scan port number", sa.s +i +c +2);
            break;
          }
        }
        else
          port =514;
        ld->udpaddr.sin_port =htons(port);
        break;
      case 'p':
        if (len > 1) {
          while (! stralloc_copys(&ld->prefix, &sa.s[i +1])) pause_nomem();
          while (! stralloc_0(&ld->prefix)) pause_nomem();
        }
        break;
      }
      i +=len;
    }
  }

  /* open current */
  if ((i =stat("current", &st)) != -1) {
    if (st.st_size && ! (st.st_mode & S_IXUSR)) {
      ld->fnsave[25] ='.'; ld->fnsave[26] ='u'; ld->fnsave[27] =0;
      do {
        taia_now(&now);
        fmt_taia(ld->fnsave, &now);
        errno =0;
      } while ((stat(ld->fnsave, &st) != -1) || (errno != error_noent));
      while (rename("current", ld->fnsave) == -1)
        pause2("unable to rename current", ld->name);
      rmoldest(ld);
      i =-1;
    }
    else
      ld->size =st.st_size;
  }
  else
    if (errno != error_noent) {
      logdir_close(ld);
      warn2("unable to stat current", ld->name);
      while (fchdir(fdwdir) == -1)
        pause1("unable to change to initial working directory");
      return(0);
    }
  while ((ld->fdcur =open_append("current")) == -1)
    pause2("unable to open current", ld->name);
  coe(ld->fdcur);
  while (fchmod(ld->fdcur, 0644) == -1)
    pause2("unable to set mode of current", ld->name);
  buffer_init(&ld->b, buffer_pwrite, ld -dir, ld->btmp, buflen);

  if (verbose) {
    if (i == 0) strerr_warn4(INFO, "append: ", ld->name, "/current", 0);
    else strerr_warn4(INFO, "new: ", ld->name, "/current", 0);
  }

  while (fchdir(fdwdir) == -1)
    pause1("unable to change to initial working directory");
  return(1);
}